

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzerSettings.cpp
# Opt level: O0

void __thiscall
AsyncRgbLedAnalyzerSettings::AsyncRgbLedAnalyzerSettings(AsyncRgbLedAnalyzerSettings *this)

{
  bool bVar1;
  AnalyzerSettingInterfaceChannel *this_00;
  pointer pAVar2;
  AnalyzerSettingInterfaceNumberList *this_01;
  pointer pAVar3;
  char *pcVar4;
  ulong uVar5;
  Channel *pCVar6;
  uint uVar7;
  LedControllerData *controllerData;
  iterator __end1;
  iterator __begin1;
  vector<AsyncRgbLedAnalyzerSettings::LedControllerData,_std::allocator<AsyncRgbLedAnalyzerSettings::LedControllerData>_>
  *__range1;
  int index;
  AsyncRgbLedAnalyzerSettings *this_local;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__AsyncRgbLedAnalyzerSettings_0011ad58;
  this->mLEDController = LED_WS2811;
  uVar5 = 0xffffffffffffffff;
  Channel::Channel(&this->mInputChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  std::
  unique_ptr<AnalyzerSettingInterfaceChannel,std::default_delete<AnalyzerSettingInterfaceChannel>>::
  unique_ptr<std::default_delete<AnalyzerSettingInterfaceChannel>,void>
            ((unique_ptr<AnalyzerSettingInterfaceChannel,std::default_delete<AnalyzerSettingInterfaceChannel>>
              *)&this->mInputChannelInterface);
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,std::default_delete<AnalyzerSettingInterfaceNumberList>>
  ::unique_ptr<std::default_delete<AnalyzerSettingInterfaceNumberList>,void>
            ((unique_ptr<AnalyzerSettingInterfaceNumberList,std::default_delete<AnalyzerSettingInterfaceNumberList>>
              *)&this->mControllerInterface);
  std::
  vector<AsyncRgbLedAnalyzerSettings::LedControllerData,_std::allocator<AsyncRgbLedAnalyzerSettings::LedControllerData>_>
  ::vector(&this->mControllers);
  InitControllerData(this);
  this_00 = (AnalyzerSettingInterfaceChannel *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar5);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_00);
  std::
  unique_ptr<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  ::reset(&this->mInputChannelInterface,this_00);
  pAVar2 = std::
           unique_ptr<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
           ::operator->(&this->mInputChannelInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar2,"LED Channel");
  pAVar2 = std::
           unique_ptr<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
           ::operator->(&this->mInputChannelInterface);
  pCVar6 = &this->mInputChannel;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)pAVar2);
  this_01 = (AnalyzerSettingInterfaceNumberList *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar6);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(this_01);
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ::reset(&this->mControllerInterface,this_01);
  pAVar3 = std::
           unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ::operator->(&this->mControllerInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar3,"LED Controller");
  __range1._0_4_ = 0;
  __end1 = std::
           vector<AsyncRgbLedAnalyzerSettings::LedControllerData,_std::allocator<AsyncRgbLedAnalyzerSettings::LedControllerData>_>
           ::begin(&this->mControllers);
  controllerData =
       (LedControllerData *)
       std::
       vector<AsyncRgbLedAnalyzerSettings::LedControllerData,_std::allocator<AsyncRgbLedAnalyzerSettings::LedControllerData>_>
       ::end(&this->mControllers);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<AsyncRgbLedAnalyzerSettings::LedControllerData_*,_std::vector<AsyncRgbLedAnalyzerSettings::LedControllerData,_std::allocator<AsyncRgbLedAnalyzerSettings::LedControllerData>_>_>
                                *)&controllerData);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<AsyncRgbLedAnalyzerSettings::LedControllerData_*,_std::vector<AsyncRgbLedAnalyzerSettings::LedControllerData,_std::allocator<AsyncRgbLedAnalyzerSettings::LedControllerData>_>_>
    ::operator*(&__end1);
    pAVar3 = std::
             unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
             ::operator->(&this->mControllerInterface);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    AnalyzerSettingInterfaceNumberList::AddNumber((double)(int)__range1,(char *)pAVar3,pcVar4);
    __gnu_cxx::
    __normal_iterator<AsyncRgbLedAnalyzerSettings::LedControllerData_*,_std::vector<AsyncRgbLedAnalyzerSettings::LedControllerData,_std::allocator<AsyncRgbLedAnalyzerSettings::LedControllerData>_>_>
    ::operator++(&__end1);
    __range1._0_4_ = (int)__range1 + 1;
  }
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ::operator->(&this->mControllerInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mLEDController);
  std::
  unique_ptr<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  ::get(&this->mInputChannelInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ::get(&this->mControllerInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar7 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar7,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar7,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar7,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel
            ((Channel *)this,(char *)&this->mInputChannel,SUB81(DEFAULT_CHANNEL_NAME,0));
  return;
}

Assistant:

AsyncRgbLedAnalyzerSettings::AsyncRgbLedAnalyzerSettings()
{
    InitControllerData();

    mInputChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mInputChannelInterface->SetTitleAndTooltip( "LED Channel", "Standard Addressable LEDs (Async)" );
    mInputChannelInterface->SetChannel( mInputChannel );

    mControllerInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mControllerInterface->SetTitleAndTooltip( "LED Controller", "Specify the LED controller in use." );

    int index = 0;

    for( const auto& controllerData : mControllers )
    {
        mControllerInterface->AddNumber( index++, controllerData.mName.c_str(), controllerData.mDescription.c_str() );
    }

    mControllerInterface->SetNumber( mLEDController );

    AddInterface( mInputChannelInterface.get() );
    AddInterface( mControllerInterface.get() );

    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mInputChannel, DEFAULT_CHANNEL_NAME, false );
}